

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessConstantBuffer
          (ConversionStream *this,iterator *Token)

{
  TokenListType *this_00;
  _List_node_base *p_Var1;
  bool bVar2;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  iterator CurrToken;
  const_iterator cVar4;
  _List_node_base *p_Var5;
  allocator local_d9;
  String local_d8;
  string msg;
  string local_68;
  string local_48;
  
  p_Var5 = Token->_M_node;
  if (*(int *)&p_Var5[1]._M_next != 0xd1) {
    FormatString<char[26],char[37]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::kw_cbuffer",(char (*) [37])in_RCX);
    in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x395;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ProcessConstantBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x395);
    std::__cxx11::string::~string((string *)&msg);
    p_Var5 = Token->_M_node;
  }
  std::__cxx11::string::assign((char *)&p_Var5[1]._M_prev);
  p_Var5 = Token->_M_node->_M_next;
  Token->_M_node = p_Var5;
  this_00 = &this->m_Tokens;
  if (p_Var5 == (_List_node_base *)this_00) {
    FormatString<char[39]>(&msg,(char (*) [39])"Unexpected EOF after \"cbuffer\" keyword");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&local_d8,this,Token,4)
    ;
    in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39f;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessConstantBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x39f,&msg,(char (*) [2])0x5ddb85,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&msg);
    p_Var5 = Token->_M_node;
  }
  if (*(int *)&p_Var5[1]._M_next != 0x13b) {
    FormatString<char[44]>(&msg,(char (*) [44])"Identifier expected after \"cbuffer\" keyword");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&local_d8,this,Token,4)
    ;
    in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a0;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessConstantBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3a0,&msg,(char (*) [2])0x5ddb85,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&msg);
    p_Var5 = Token->_M_node;
  }
  p_Var1 = p_Var5->_M_next;
  Token->_M_node = p_Var1;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &p_Var1[1]._M_prev,":");
  if (bVar2) {
    while ((cVar4._M_node = Token->_M_node, cVar4._M_node != (_List_node_base *)this_00 &&
           (*(int *)&cVar4._M_node[1]._M_next != 0x133))) {
      Token->_M_node = (cVar4._M_node)->_M_next;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      erase(this_00,cVar4);
    }
  }
  else {
    cVar4._M_node = Token->_M_node;
  }
  while (cVar4._M_node != (_List_node_base *)this_00) {
    if (*(int *)&cVar4._M_node[1]._M_next == 0x133) goto LAB_00295012;
    cVar4._M_node = (cVar4._M_node)->_M_next;
    Token->_M_node = cVar4._M_node;
  }
  FormatString<char[49],std::__cxx11::string>
            (&msg,(Diligent *)"Missing open brace in the definition of cbuffer ",
             (char (*) [49])&p_Var5[1]._M_prev,in_RCX);
  PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&local_d8,this,Token,4);
  in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3bb;
  LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
            (false,"ProcessConstantBuffer",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
             ,0x3bb,&msg,(char (*) [2])0x5ddb85,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&msg);
  cVar4._M_node = Token->_M_node;
LAB_00295012:
  msg._M_dataplus._M_p =
       (pointer)(this_00->
                super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                )._M_impl._M_node.super__List_node_base._M_next;
  local_d8._M_dataplus._M_p = (pointer)this_00;
  _Var3 = Parsing::FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&msg,
                     (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&local_d8,cVar4._M_node);
  Token->_M_node = _Var3._M_node;
  if (_Var3._M_node == (_List_node_base *)this_00) {
    FormatString<char[62],std::__cxx11::string>
              (&msg,(Diligent *)"No matching closing brace found in the definition of cbuffer ",
               (char (*) [62])&p_Var5[1]._M_prev,in_RCX);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&local_d8,this,Token,4)
    ;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessConstantBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3bf,&msg,(char (*) [2])0x5ddb85,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&msg);
    _Var3._M_node = Token->_M_node;
  }
  cVar4._M_node = (_Var3._M_node)->_M_next;
  Token->_M_node = cVar4._M_node;
  if ((cVar4._M_node == (_List_node_base *)this_00) || (*(int *)&cVar4._M_node[1]._M_next != 0x13e))
  {
    std::__cxx11::string::string((string *)&local_48,";",(allocator *)&local_d8);
    std::__cxx11::string::string((string *)&local_68,"",&local_d9);
    Parsing::HLSLTokenInfo::HLSLTokenInfo
              ((HLSLTokenInfo *)&msg,Semicolon,&local_48,&local_68,0xffffffffffffffff);
    std::__cxx11::
    list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
    emplace<Diligent::Parsing::HLSLTokenInfo>(this_00,cVar4,(HLSLTokenInfo *)&msg);
    Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessConstantBuffer(TokenListType::iterator& Token)
{
    VERIFY_EXPR(Token->Type == TokenType::kw_cbuffer);

    // Replace "cbuffer" with "uniform"
    Token->Literal = m_bUseRowMajorMatrices ?
        "layout(row_major) uniform" :
        "uniform";
    ++Token;
    // cbuffer CBufferName
    //         ^

    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF after \"cbuffer\" keyword");
    VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Identifier expected after \"cbuffer\" keyword");
    const auto& CBufferName = Token->Literal;

    ++Token;
    // cbuffer CBufferName
    //                    ^
    if (Token->Literal == ":")
    {
        // cbuffer CBufferName : register(b0) {
        //                     ^

        // Remove register
        while (Token != m_Tokens.end() && Token->Type != TokenType::OpenBrace)
        {
            auto CurrToken = Token;
            ++Token;
            m_Tokens.erase(CurrToken);
        }
        // cbuffer CBufferName {
        //                     ^
    }

    while (Token != m_Tokens.end() && Token->Type != TokenType::OpenBrace)
        ++Token;
    // cbuffer CBufferName
    // {
    // ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Missing open brace in the definition of cbuffer ", CBufferName);

    // Find closing brace
    Token = Parsing::FindMatchingBracket(m_Tokens.begin(), m_Tokens.end(), Token);
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "No matching closing brace found in the definition of cbuffer ", CBufferName);

    ++Token; // Skip closing brace
    // cbuffer CBufferName
    // {
    //    ...
    // }
    // int a
    // ^

    if (Token == m_Tokens.end() || Token->Type != TokenType::Semicolon)
    {
        m_Tokens.insert(Token, TokenInfo(TokenType::Semicolon, ";"));
        // cbuffer CBufferName
        // {
        //    ...
        // };
        // int a;
        // ^
    }
}